

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

int regex_is_match(regex_handle *re,char *subject)

{
  undefined8 *puVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  int ret;
  pcre2_match_data_8 *match_data;
  size_t sub_len;
  PCRE2_SPTR8 sub;
  regex_priv *priv;
  char *subject_local;
  regex_handle *re_local;
  
  puVar1 = (undefined8 *)re->priv;
  sVar3 = strlen(subject);
  lVar4 = pcre2_match_data_create_from_pattern_8(*puVar1,0);
  if (lVar4 == 0) {
    re_local._4_4_ = -0x16;
  }
  else {
    iVar2 = pcre2_match_8(*puVar1,subject,sVar3,0,0,lVar4,0);
    pcre2_match_data_free_8(lVar4);
    if (iVar2 < 0) {
      if (iVar2 == -1) {
        re_local._4_4_ = 0;
      }
      else {
        re_local._4_4_ = -0x16;
      }
    }
    else {
      re_local._4_4_ = 1;
    }
  }
  return re_local._4_4_;
}

Assistant:

int regex_is_match(const struct regex_handle *re, const char *subject)
{
	const struct regex_priv *priv = (const struct regex_priv *)re->priv;
	PCRE2_SPTR sub = (PCRE2_SPTR)subject;
	size_t sub_len = strlen(subject);
	pcre2_match_data *match_data = pcre2_match_data_create_from_pattern(priv->re, NULL);
	int ret;

	if (match_data == NULL)
		return -EINVAL;

	ret = pcre2_match(priv->re, sub, sub_len, 0, 0, match_data, NULL);

	pcre2_match_data_free(match_data);

	if (ret < 0) {
		if (ret == PCRE2_ERROR_NOMATCH)
			return 0;
		else
			return -EINVAL;
	} else {
		return 1;
	}
}